

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O3

void __thiscall Test<Imf_3_4::Header>::testFind(Test<Imf_3_4::Header> *this,string *name)

{
  long lVar1;
  long lVar2;
  Header header;
  undefined8 local_50;
  Header local_48 [56];
  
  local_50 = 0;
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  lVar1 = Imf_3_4::Header::find((string *)local_48);
  lVar2 = Imf_3_4::Header::end();
  if (lVar1 != lVar2) {
    Imf_3_4::Header::~Header(local_48);
    return;
  }
  __assert_fail("iterator != header.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x1e,
                "void Test<Imf_3_4::Header>::testFind(const string &) [Header = Imf_3_4::Header]");
}

Assistant:

void testFind (const string& name)
    {
        Header header;
        auto   iterator = header.find (name);
        assert (iterator != header.end ());
    }